

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

int szipLoadEntry(SZIPinfo *info,PHYSFS_uint32 idx)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  Byte *pBVar4;
  uint isdir;
  uint in_EAX;
  PHYSFS_uint16 *src;
  char *dst;
  void *pvVar5;
  int iVar6;
  undefined1 *puVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  uint local_38;
  PHYSFS_uint32 local_34;
  
  puVar8 = &local_38;
  psVar1 = (info->db).FileNameOffsets;
  lVar9 = psVar1[(ulong)idx + 1] - psVar1[idx];
  uVar10 = lVar9 * 2;
  if (uVar10 < 0x100) {
    puVar8 = (uint *)((long)&local_38 - (uVar10 + 0x17 & 0xfffffffffffffff0));
    puVar7 = (undefined1 *)puVar8;
  }
  else {
    puVar7 = (undefined1 *)0x0;
  }
  local_38 = in_EAX;
  local_34 = idx;
  *(undefined8 *)((long)puVar8 + -8) = 0x11455c;
  src = (PHYSFS_uint16 *)__PHYSFS_initSmallAlloc(puVar7,uVar10);
  uVar10 = lVar9 * 4;
  if (uVar10 < 0x100) {
    puVar8 = (uint *)((long)puVar8 + -(uVar10 + 0x17 & 0xfffffffffffffff0));
    puVar7 = (undefined1 *)puVar8;
  }
  else {
    puVar7 = (undefined1 *)0x0;
  }
  *(undefined8 *)((long)puVar8 + -8) = 0x11458a;
  dst = (char *)__PHYSFS_initSmallAlloc(puVar7,uVar10);
  if ((src == (PHYSFS_uint16 *)0x0) || (dst == (char *)0x0)) {
    iVar6 = 0;
  }
  else {
    psVar1 = (info->db).FileNameOffsets;
    local_38 = (uint)((byte)((info->db).IsDirs[local_34 >> 3] << ((byte)local_34 & 7)) >> 7);
    sVar2 = psVar1[idx];
    sVar3 = psVar1[(ulong)idx + 1];
    if (sVar3 != sVar2) {
      pBVar4 = (info->db).FileNames;
      lVar9 = 0;
      do {
        src[lVar9] = *(PHYSFS_uint16 *)(pBVar4 + lVar9 * 2 + sVar2 * 2);
        lVar9 = lVar9 + 1;
      } while (sVar3 - sVar2 != lVar9);
    }
    *(undefined8 *)((long)puVar8 + -8) = 0x114602;
    PHYSFS_utf8FromUtf16(src,dst,uVar10);
    isdir = local_38;
    *(undefined8 *)((long)puVar8 + -8) = 0x114610;
    pvVar5 = __PHYSFS_DirTreeAdd(&info->tree,dst,isdir);
    iVar6 = 0;
    if (pvVar5 != (void *)0x0) {
      *(PHYSFS_uint32 *)((long)pvVar5 + 0x28) = local_34;
      iVar6 = 1;
    }
  }
  *(undefined8 *)((long)puVar8 + -8) = 0x114631;
  __PHYSFS_smallFree(dst);
  *(undefined8 *)((long)puVar8 + -8) = 0x114639;
  __PHYSFS_smallFree(src);
  return iVar6;
}

Assistant:

static int szipLoadEntry(SZIPinfo *info, const PHYSFS_uint32 idx)
{
    const size_t utf16len = SzArEx_GetFileNameUtf16(&info->db, idx, NULL);
    const size_t utf16buflen = utf16len * 2;
    PHYSFS_uint16 *utf16 = (PHYSFS_uint16 *) __PHYSFS_smallAlloc(utf16buflen);
    const size_t utf8buflen = utf16len * 4;
    char *utf8 = (char *) __PHYSFS_smallAlloc(utf8buflen);
    int retval = 0;

    if (utf16 && utf8)
    {
        const int isdir = SzArEx_IsDir(&info->db, idx) != 0;
        SZIPentry *entry;
        SzArEx_GetFileNameUtf16(&info->db, idx, (UInt16 *) utf16);
        PHYSFS_utf8FromUtf16(utf16, utf8, utf8buflen);
        entry = (SZIPentry*) __PHYSFS_DirTreeAdd(&info->tree, utf8, isdir);
        retval = (entry != NULL);
        if (retval)
            entry->dbidx = idx;
    } /* if */

    __PHYSFS_smallFree(utf8);
    __PHYSFS_smallFree(utf16);

    return retval;
}